

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Sched.c
# Opt level: O2

void Llb_MtrVerifyColumns(Llb_Mtr_t *p,int iGrpStart)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)p->nRows;
  if (p->nRows < 1) {
    uVar1 = uVar2;
  }
  do {
    if (uVar2 == uVar1) {
      return;
    }
    if (p->pProdVars[uVar2] != '\0') {
      iVar3 = 0;
      for (lVar4 = (long)iGrpStart; lVar4 < p->nCols; lVar4 = lVar4 + 1) {
        iVar3 = iVar3 + (uint)(p->pMatrix[lVar4][uVar2] == '\x01');
      }
      if (iVar3 != p->pProdNums[uVar2]) {
        __assert_fail("Counter == p->pProdNums[iVar]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Sched.c"
                      ,0xcd,"void Llb_MtrVerifyColumns(Llb_Mtr_t *, int)");
      }
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void Llb_MtrVerifyColumns( Llb_Mtr_t * p, int iGrpStart )
{
    int iVar, iGrp, Counter;
    for ( iVar = 0; iVar < p->nRows; iVar++ )
    {
        if ( p->pProdVars[iVar] == 0 )
            continue;
        Counter = 0;
        for ( iGrp = iGrpStart; iGrp < p->nCols; iGrp++ )
            if ( p->pMatrix[iGrp][iVar] == 1 )
                Counter++;
        assert( Counter == p->pProdNums[iVar] );
        if ( Counter != p->pProdNums[iVar] )
            Abc_Print( -1, "Llb_MtrVerifyColumns(): Internal error.\n" );
    }
}